

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<int,_QSocketNotifierSetUNIX>::erase
          (QHash<int,_QSocketNotifierSetUNIX> *this,const_iterator it)

{
  long lVar1;
  piter pVar2;
  piter it_00;
  iterator other;
  Bucket bucket_00;
  bool bVar3;
  size_t sVar4;
  Span *in_RDX;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *in_RSI;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *in_RDI;
  long in_FS_OFFSET;
  iterator iVar5;
  Bucket bucket;
  iterator i;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *in_stack_ffffffffffffff68;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *in_stack_ffffffffffffff70;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this_00;
  Bucket local_48;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *local_38;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *local_28;
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *pDVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = in_RSI;
  detach((QHash<int,_QSocketNotifierSetUNIX> *)in_stack_ffffffffffffff70);
  pDVar6 = (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = local_28;
  other.bucket = (size_t)in_RDX;
  other.d = local_28;
  iVar5 = QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::detachedIterator
                    (*(Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> **)in_RDI,other);
  this_00 = iVar5.d;
  it_00.bucket = (size_t)in_RDI;
  it_00.d = in_stack_ffffffffffffff70;
  iterator::iterator((iterator *)in_stack_ffffffffffffff68,it_00);
  local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  iVar5.bucket = (size_t)in_stack_ffffffffffffff70;
  iVar5.d = in_stack_ffffffffffffff68;
  QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Bucket::Bucket
            ((Bucket *)0x6bb14a,iVar5);
  bucket_00.index = (size_t)pDVar6;
  bucket_00.span = in_RDX;
  QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::erase(in_RDI,bucket_00);
  sVar4 = QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Bucket::
          toBucketIndex(&local_48,*(Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> **)in_RDI
                       );
  if ((sVar4 == *(long *)(*(long *)in_RDI + 0x10) - 1U) ||
     (bVar3 = QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Bucket::isUnused
                        ((Bucket *)0x6bb1a6), bVar3)) {
    iterator::operator++((iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  pVar2.d = pDVar6;
  return (iterator)pVar2;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(it != constEnd());
        detach();
        // ensure a valid iterator across the detach:
        iterator i = iterator{d->detachedIterator(it.i)};
        typename Data::Bucket bucket(i.i);

        d->erase(bucket);
        if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
            ++i;
        return i;
    }